

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_tools.cpp
# Opt level: O2

string * getArticle(string *__return_storage_ptr__,string *word)

{
  int iVar1;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> _Var2;
  allocator *paVar3;
  char *pcVar4;
  initializer_list<char> __l;
  allocator local_1b;
  allocator local_1a;
  allocator_type local_19;
  char local_18 [8];
  
  if (getArticle(std::__cxx11::string)::vowels == '\0') {
    iVar1 = __cxa_guard_acquire(&getArticle(std::__cxx11::string)::vowels);
    if (iVar1 != 0) {
      builtin_strncpy(local_18,"aeiou",5);
      __l._M_len = 5;
      __l._M_array = local_18;
      std::vector<char,_std::allocator<char>_>::vector(&getArticle::vowels,__l,&local_19);
      __cxa_atexit(std::vector<char,_std::allocator<char>_>::~vector,&getArticle::vowels,
                   &__dso_handle);
      __cxa_guard_release(&getArticle(std::__cxx11::string)::vowels);
    }
  }
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                    (getArticle::vowels.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     getArticle::vowels.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish,(word->_M_dataplus)._M_p);
  if (_Var2._M_current ==
      getArticle::vowels.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pcVar4 = "a";
    paVar3 = &local_1a;
  }
  else {
    pcVar4 = "an";
    paVar3 = &local_1b;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar4,paVar3);
  return __return_storage_ptr__;
}

Assistant:

std::string getArticle(std::string word) {
  static const std::vector<char> vowels = { 'a', 'e', 'i', 'o', 'u' };
  auto iter = std::find(vowels.begin(), vowels.end(), word[0]);
  if(iter == vowels.end()) { return "a"; }
  return "an";
}